

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libperfetto-connector.cpp
# Opt level: O3

void kokkosp_begin_deep_copy
               (SpaceHandle dst_handle,char *dst_name,void *dst_ptr,SpaceHandle src_handle,
               char *src_name,void *src_ptr,uint64_t size)

{
  anon_class_8_1_dda845c3 local_e8;
  char **local_e0;
  uint64_t *local_d8;
  char ***local_d0;
  char *local_c8;
  void **local_c0;
  void **local_b8;
  uint64_t local_b0;
  void *local_a8;
  char *local_a0;
  void *local_98;
  anon_class_56_7_af1e77c7 local_90;
  char local_58 [8];
  char acStack_50 [8];
  char local_48 [8];
  char acStack_40 [8];
  char local_38 [8];
  char acStack_30 [8];
  char local_28 [8];
  char acStack_20 [8];
  char local_18 [8];
  char acStack_10 [16];
  
  local_d0 = &local_90.src_name;
  local_58[0] = dst_handle.name[0x30];
  local_58[1] = dst_handle.name[0x31];
  local_58[2] = dst_handle.name[0x32];
  local_58[3] = dst_handle.name[0x33];
  local_58[4] = dst_handle.name[0x34];
  local_58[5] = dst_handle.name[0x35];
  local_58[6] = dst_handle.name[0x36];
  local_58[7] = dst_handle.name[0x37];
  acStack_50[0] = dst_handle.name[0x38];
  acStack_50[1] = dst_handle.name[0x39];
  acStack_50[2] = dst_handle.name[0x3a];
  acStack_50[3] = dst_handle.name[0x3b];
  acStack_50[4] = dst_handle.name[0x3c];
  acStack_50[5] = dst_handle.name[0x3d];
  acStack_50[6] = dst_handle.name[0x3e];
  acStack_50[7] = dst_handle.name[0x3f];
  local_90.dst_ptr = (void **)dst_handle.name._32_8_;
  local_90.src_ptr = (void **)dst_handle.name._40_8_;
  local_90.dst_handle = (SpaceHandle *)dst_handle.name._16_8_;
  local_90.src_handle = (SpaceHandle *)dst_handle.name._24_8_;
  local_90.src_name = (char **)dst_handle.name._0_8_;
  local_90.size = (uint64_t *)dst_handle.name._8_8_;
  local_c8 = local_48;
  local_18[0] = src_handle.name[0x30];
  local_18[1] = src_handle.name[0x31];
  local_18[2] = src_handle.name[0x32];
  local_18[3] = src_handle.name[0x33];
  local_18[4] = src_handle.name[0x34];
  local_18[5] = src_handle.name[0x35];
  local_18[6] = src_handle.name[0x36];
  local_18[7] = src_handle.name[0x37];
  acStack_10[0] = src_handle.name[0x38];
  acStack_10[1] = src_handle.name[0x39];
  acStack_10[2] = src_handle.name[0x3a];
  acStack_10[3] = src_handle.name[0x3b];
  acStack_10[4] = src_handle.name[0x3c];
  acStack_10[5] = src_handle.name[0x3d];
  acStack_10[6] = src_handle.name[0x3e];
  acStack_10[7] = src_handle.name[0x3f];
  local_28[0] = src_handle.name[0x20];
  local_28[1] = src_handle.name[0x21];
  local_28[2] = src_handle.name[0x22];
  local_28[3] = src_handle.name[0x23];
  local_28[4] = src_handle.name[0x24];
  local_28[5] = src_handle.name[0x25];
  local_28[6] = src_handle.name[0x26];
  local_28[7] = src_handle.name[0x27];
  acStack_20[0] = src_handle.name[0x28];
  acStack_20[1] = src_handle.name[0x29];
  acStack_20[2] = src_handle.name[0x2a];
  acStack_20[3] = src_handle.name[0x2b];
  acStack_20[4] = src_handle.name[0x2c];
  acStack_20[5] = src_handle.name[0x2d];
  acStack_20[6] = src_handle.name[0x2e];
  acStack_20[7] = src_handle.name[0x2f];
  local_38[0] = src_handle.name[0x10];
  local_38[1] = src_handle.name[0x11];
  local_38[2] = src_handle.name[0x12];
  local_38[3] = src_handle.name[0x13];
  local_38[4] = src_handle.name[0x14];
  local_38[5] = src_handle.name[0x15];
  local_38[6] = src_handle.name[0x16];
  local_38[7] = src_handle.name[0x17];
  acStack_30[0] = src_handle.name[0x18];
  acStack_30[1] = src_handle.name[0x19];
  acStack_30[2] = src_handle.name[0x1a];
  acStack_30[3] = src_handle.name[0x1b];
  acStack_30[4] = src_handle.name[0x1c];
  acStack_30[5] = src_handle.name[0x1d];
  acStack_30[6] = src_handle.name[0x1e];
  acStack_30[7] = src_handle.name[0x1f];
  local_48[0] = src_handle.name[0];
  local_48[1] = src_handle.name[1];
  local_48[2] = src_handle.name[2];
  local_48[3] = src_handle.name[3];
  local_48[4] = src_handle.name[4];
  local_48[5] = src_handle.name[5];
  local_48[6] = src_handle.name[6];
  local_48[7] = src_handle.name[7];
  acStack_40[0] = src_handle.name[8];
  acStack_40[1] = src_handle.name[9];
  acStack_40[2] = src_handle.name[10];
  acStack_40[3] = src_handle.name[0xb];
  acStack_40[4] = src_handle.name[0xc];
  acStack_40[5] = src_handle.name[0xd];
  acStack_40[6] = src_handle.name[0xe];
  acStack_40[7] = src_handle.name[0xf];
  local_e8.callback = &local_90;
  local_c0 = &local_98;
  local_e0 = &local_a0;
  local_b8 = &local_a8;
  local_d8 = &local_b0;
  if (DAT_003b0dcd != 0) {
    local_b0 = size;
    local_a8 = src_ptr;
    local_a0 = src_name;
    local_98 = dst_ptr;
    local_90.dst_name = (char **)dst_name;
    perfetto::internal::
    TrackEventDataSource<perfetto::TrackEvent,_&perfetto::internal::kCategoryRegistry>::
    CallIfCategoryEnabled<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/perfetto-connector/libperfetto-connector.cpp:210:3)>
    ::anon_class_8_1_dda845c3::operator()(&local_e8,(uint)DAT_003b0dcd);
  }
  return;
}

Assistant:

void kokkosp_begin_deep_copy(SpaceHandle dst_handle, const char *dst_name,
                             const void *dst_ptr, SpaceHandle src_handle,
                             const char *src_name, const void *src_ptr,
                             uint64_t size) {
  TRACE_EVENT_BEGIN("kokkos.deep_copy", nullptr,
                    [&](perfetto::EventContext ctx) {
                      std::stringstream _name;
                      _name << dst_name << "->" << src_name;
                      ctx.event()->set_name(_name.str());
                      add_annotation(ctx, "size", size);
                      add_annotation(ctx, "dest_type", dst_handle.name);
                      add_annotation(ctx, "src_type", src_handle.name);
                      add_annotation(ctx, "dest_address", dst_ptr);
                      add_annotation(ctx, "src_address", src_ptr);
                    });
}